

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void mstltest(void)

{
  int __ptr [2];
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t __nmemb;
  double **seasonal;
  double *pdVar3;
  double *remainder;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double local_9cb8;
  double temp [5000];
  uint local_68 [2];
  int f [2];
  int local_40 [2];
  int iterate;
  int s_window;
  int Nseas;
  
  __stream = fopen("../data/taylor.txt","r");
  if (__stream != (FILE *)0x0) {
    pdVar3 = &local_9cb8;
    lVar7 = 0;
    s_window = 0;
    while( true ) {
      iVar2 = feof(__stream);
      iVar1 = s_window;
      if (iVar2 != 0) break;
      __isoc99_fscanf(__stream,"%lf \n",pdVar3);
      s_window = s_window + 1;
      lVar7 = lVar7 + 0x100000000;
      pdVar3 = pdVar3 + 1;
    }
    uVar6 = 0;
    printf("N %d \n",(ulong)(uint)s_window);
    __nmemb = lVar7 >> 0x20;
    f = (int  [2])malloc(lVar7 >> 0x1d);
    uVar5 = 0;
    if (0 < iVar1) {
      uVar5 = (ulong)(uint)iVar1;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      *(double *)((long)f + uVar6 * 8) = temp[uVar6 - 1];
    }
    local_40[0] = 2;
    local_68[0] = 0x30;
    local_68[1] = 0x150;
    local_40[1] = 0xd;
    iterate = local_40[0];
    seasonal = (double **)calloc(2,8);
    pdVar3 = (double *)calloc(__nmemb,8);
    remainder = (double *)calloc(__nmemb,8);
    for (lVar7 = 0; iVar1 = s_window, lVar7 != 2; lVar7 = lVar7 + 1) {
      pdVar4 = (double *)calloc(__nmemb,8);
      seasonal[lVar7] = pdVar4;
    }
    mstl((double *)f,s_window,(int *)local_68,&iterate,local_40 + 1,(double *)0x0,local_40,seasonal,
         pdVar3,remainder);
    uVar5 = 0;
    if (0 < iVar1) {
      uVar5 = (ulong)(uint)iVar1;
    }
    for (lVar7 = 0; iVar1 = s_window, lVar7 < iterate; lVar7 = lVar7 + 1) {
      printf("\n Seasonal%d :\n",(ulong)(uint)f[lVar7 + -2]);
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        printf("%g ",seasonal[lVar7][uVar6]);
      }
      puts("\n");
    }
    mdisplay(pdVar3,1,s_window);
    mdisplay(remainder,1,iVar1);
    __ptr = f;
    printf("\n %g %g %g %g \n",*(undefined8 *)f,*(undefined8 *)((long)f + 8),
           *(undefined8 *)((long)f + -0x10 + __nmemb * 8),
           *(undefined8 *)((long)f + -8 + __nmemb * 8));
    free(seasonal);
    free(pdVar3);
    free(remainder);
    free((void *)__ptr);
    fclose(__stream);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void mstltest() {
	FILE *ifp;
	double temp[5000];
	double *x;
    ifp = fopen("../data/taylor.txt", "r");
	int N;
	int i,j;

	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}

	N = i;

	printf("N %d \n",N);

	x = (double*) malloc(sizeof(double)*N);

	for(i = 0; i < N;++i) {
		x[i] = temp[i];
	}
	int Nseas = 2;
	int f[2] = {48,336};
	int iterate = 2;
	double **seasonal,*trend,*remainder;
	int s_window = 13;
	double lambda;

	seasonal = (double**)calloc(Nseas,sizeof(double*));
	trend = (double*)calloc(N,sizeof(double));
	remainder = (double*)calloc(N,sizeof(double));

	for(i = 0; i < Nseas;++i) {
		seasonal[i] = (double*)calloc(N,sizeof(double));
	}

	mstl(x, N,f,&Nseas,&s_window,NULL,&iterate,seasonal,trend,remainder);

	for(i = 0; i < Nseas;++i) {
		printf("\n Seasonal%d :\n",f[i]);
		for(j = 0; j < N;++j) {
			printf("%g ",seasonal[i][j]);
		}
		printf("\n\n");
	}

	mdisplay(trend,1,N);
	mdisplay(remainder,1,N);

	printf("\n %g %g %g %g \n",x[0],x[1],x[N-2],x[N-1]);
	free(seasonal);
	free(trend);
	free(remainder);
	free(x);
	fclose(ifp);
}